

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O2

void __thiscall
Catch::Capturer::captureValues<char[100],int,char[3],char[5]>
          (Capturer *this,size_t index,char (*value) [100],int *values,char (*values_1) [3],
          char (*values_2) [5])

{
  string local_50;
  
  StringMaker<char[100],void>::convert_abi_cxx11_
            (&local_50,(StringMaker<char[100],void> *)value,*value);
  captureValue(this,index,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  captureValues<int,char[3],char[5]>(this,index + 1,values,values_1,values_2);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }